

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O0

FL_BLINE * __thiscall Fl_Browser::_remove(Fl_Browser *this,int line)

{
  int iVar1;
  FL_BLINE *item;
  FL_BLINE *ttt;
  int line_local;
  Fl_Browser *this_local;
  
  item = find_line(this,line);
  Fl_Browser_::deleting(&this->super_Fl_Browser_,item);
  this->cacheline = line + -1;
  this->cache = item->prev;
  this->lines = this->lines + -1;
  iVar1 = (*(this->super_Fl_Browser_).super_Fl_Group.super_Fl_Widget._vptr_Fl_Widget[0xe])
                    (this,item);
  this->full_height_ = this->full_height_ - iVar1;
  if (item->prev == (FL_BLINE *)0x0) {
    this->first = item->next;
  }
  else {
    item->prev->next = item->next;
  }
  if (item->next == (FL_BLINE *)0x0) {
    this->last = item->prev;
  }
  else {
    item->next->prev = item->prev;
  }
  return item;
}

Assistant:

FL_BLINE* Fl_Browser::_remove(int line) {
  FL_BLINE* ttt = find_line(line);
  deleting(ttt);

  cacheline = line-1;
  cache = ttt->prev;
  lines--;
  full_height_ -= item_height(ttt);
  if (ttt->prev) ttt->prev->next = ttt->next;
  else first = ttt->next;
  if (ttt->next) ttt->next->prev = ttt->prev;
  else last = ttt->prev;

  return(ttt);
}